

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_size_tests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b9e812::AV1LosslessFrameSizeTests_LosslessEncode_Test::TestBody
          (AV1LosslessFrameSizeTests_LosslessEncode_Test *this)

{
  bool bVar1;
  DummyVideoSource *in_RDI;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  RandomVideoSource video;
  uint in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  RandomVideoSource *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  Type in_stack_ffffffffffffff9c;
  HasNewFatalFailureHelper *in_stack_ffffffffffffffa0;
  undefined1 local_40 [40];
  Message *in_stack_ffffffffffffffe8;
  AssertHelper *in_stack_fffffffffffffff0;
  
  libaom_test::ACMRandom::DeterministicSeed();
  libaom_test::RandomVideoSource::RandomVideoSource
            (in_stack_ffffffffffffff80,(int)((ulong)local_40 >> 0x20));
  libaom_test::DummyVideoSource::SetSize(in_RDI,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
  ;
  libaom_test::DummyVideoSource::set_limit((DummyVideoSource *)local_40,10);
  *(undefined4 *)&in_RDI[0x15].raw_sz_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_ffffffffffffffa0)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (**(code **)(*(long *)&in_RDI->limit_ + 0x10))(&in_RDI->limit_,local_40);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)&stack0xffffffffffffff98);
    if (bVar1) {
      in_stack_ffffffffffffff94 = 2;
    }
    else {
      in_stack_ffffffffffffff94 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)in_RDI);
    if ((in_stack_ffffffffffffff94 == 0) || (in_stack_ffffffffffffff94 != 2)) goto LAB_0088149f;
  }
  testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
             (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff8c,(char *)in_stack_ffffffffffffff80);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_RDI);
  testing::Message::~Message((Message *)0x881459);
LAB_0088149f:
  libaom_test::RandomVideoSource::~RandomVideoSource((RandomVideoSource *)0x8814a9);
  return;
}

Assistant:

TEST_P(AV1LosslessFrameSizeTests, LosslessEncode) {
  ::libaom_test::RandomVideoSource video;

  video.SetSize(frame_size_param_.width, frame_size_param_.height);
  video.set_limit(10);
  expected_res_ = AOM_CODEC_OK;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}